

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O3

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_add
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I,RWNode **val,
          bool update)

{
  _Base_ptr p_Var1;
  Offset OVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  const_iterator I_00;
  bool bVar5;
  IntervalT rest;
  _Alloc_node __an;
  DiscreteInterval<dg::Offset> local_b8;
  _Base_ptr local_a0;
  uint local_94;
  undefined1 local_90 [40];
  pointer local_68;
  _Base_ptr local_60;
  DiscreteInterval<dg::Offset> local_58;
  _Alloc_node local_48;
  _Base_ptr local_40;
  RWNode *local_38;
  
  if ((this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar3 = splitExtBorders(this,I);
    p_Var4 = (this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      local_a0 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_header;
      I_00._M_node = local_a0;
      do {
        bVar5 = *(ulong *)(p_Var4 + 1) < (I->start).offset;
        if (!bVar5) {
          I_00._M_node = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar5];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((I_00._M_node != local_a0) && (*(ulong *)(I_00._M_node + 1) <= (I->end).offset)) {
        p_Var4 = (_Base_ptr)(I->start).offset;
        local_b8.end.offset = (I->end).offset;
        local_60 = Offset::UNKNOWN;
        local_40 = (_Base_ptr)((long)&Offset::UNKNOWN[-1]._M_right + 7);
        local_94 = (uint)update;
        local_b8.start.offset = (type)p_Var4;
        do {
          p_Var1 = *(_Base_ptr *)(I_00._M_node + 1);
          if (p_Var4 < p_Var1) {
            local_58.end.offset = (long)&p_Var1[-1]._M_right + 7;
            if (local_60 == (_Base_ptr)0x1) {
              local_58.end.offset = 1;
            }
            if (p_Var1 == local_60) {
              local_58.end.offset = (type)p_Var1;
            }
            local_38 = *val;
            local_90._8_4_ = _S_red;
            local_90._16_8_ = (_Link_type)0x0;
            local_90._24_8_ = local_90 + 8;
            local_68 = (pointer)0x0;
            local_90._32_8_ = local_90._24_8_;
            local_58.start.offset = (type)p_Var4;
            local_48._M_t =
                 (_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                  *)local_90;
            std::
            _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
            ::
            _M_insert_unique_<dg::dda::RWNode*const&,std::_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>::_Alloc_node>
                      ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                        *)local_90,(const_iterator)local_90._24_8_,&local_38,&local_48);
            std::
            _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
            ::
            _M_emplace_hint_unique<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                      ((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                        *)this,I_00,&local_58,
                       (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                        *)local_90);
            std::
            _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
            ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                        *)local_90,(_Link_type)local_90._16_8_);
            p_Var4 = *(_Base_ptr *)(I_00._M_node + 1);
            bVar3 = true;
            local_b8.start.offset = (type)p_Var4;
          }
          else {
            bVar5 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                    _addValue<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                              ((DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *)this,
                               (_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                )I_00._M_node,*val,SUB41(local_94,0));
            OVar2.offset = local_b8.end.offset;
            bVar3 = (bool)(bVar3 | bVar5);
            p_Var1 = I_00._M_node[1]._M_parent;
            if (p_Var1 == (_Base_ptr)local_b8.end.offset) {
              return bVar3;
            }
            p_Var4 = (_Base_ptr)((long)&p_Var1->_M_color + 1);
            if (local_40 <= p_Var1) {
              p_Var4 = local_60;
            }
            if (p_Var1 == local_60) {
              p_Var4 = local_60;
            }
            local_b8.start.offset = (type)p_Var4;
            I_00._M_node = (_Base_ptr)std::_Rb_tree_increment(I_00._M_node);
            if ((I_00._M_node == local_a0) || (OVar2.offset < *(_Base_ptr *)(I_00._M_node + 1))) {
              local_48._M_t =
                   (_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)*val;
              local_90._8_4_ = _S_red;
              local_90._16_8_ = (_Link_type)0x0;
              local_90._24_8_ = local_90 + 8;
              local_68 = (pointer)0x0;
              local_90._32_8_ = local_90._24_8_;
              local_58.start.offset = (type)local_90;
              std::
              _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
              ::
              _M_insert_unique_<dg::dda::RWNode*const&,std::_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>::_Alloc_node>
                        ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                          *)local_90,(const_iterator)local_90._24_8_,(RWNode **)&local_48,
                         (_Alloc_node *)&local_58);
              std::
              _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
              ::
              _M_emplace_hint_unique<dg::ADT::DiscreteInterval<dg::Offset>&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                        ((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                          *)this,I_00,&local_b8,
                         (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                          *)local_90);
              goto LAB_00114fb1;
            }
          }
          if (I_00._M_node == local_a0) {
            return bVar3;
          }
        } while( true );
      }
    }
  }
  local_58.start.offset = (type)*val;
  local_90._24_8_ = local_90 + 8;
  local_90._8_4_ = _S_red;
  local_90._16_8_ = (_Link_type)0x0;
  local_68 = (pointer)0x0;
  local_b8.start.offset = (type)local_90;
  local_90._32_8_ = local_90._24_8_;
  std::
  _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
  ::
  _M_insert_unique_<dg::dda::RWNode*const&,std::_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>::_Alloc_node>
            ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
              *)local_90,(const_iterator)local_90._24_8_,(RWNode **)&local_58,
             (_Alloc_node *)&local_b8);
  std::
  _Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
  ::
  _M_emplace_unique<dg::ADT::DiscreteInterval<dg::Offset>const&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
            ((_Rb_tree<dg::ADT::DiscreteInterval<dg::Offset>,std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>,std::_Select1st<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
              *)this,I,
             (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)local_90);
LAB_00114fb1:
  std::
  _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)local_90,(_Link_type)local_90._16_8_);
  return true;
}

Assistant:

bool _add(const IntervalT &I, const ValueT &val, bool update = false) {
        if (_mapping.empty()) {
            _mapping.emplace(I, ValuesT{val});
            return true;
        }

        // fast path
        // auto fastit = _mapping.lower_bound(I);
        // if (fastit != _mapping.end() &&
        //    fastit->first == I) {
        //    return _addValue(fastit, val, update);
        //}

        // XXX: pass the lower_bound iterator from the fast path
        // so that we do not search the mapping again
        bool changed = splitExtBorders(I);
        _check();

        // splitExtBorders() arranged the intervals such
        // that some interval starts with ours
        // and some interval ends with ours.
        // Now we just create new intervals in the gaps
        // and add values to the intervals that we have

        // FIXME: splitExtBorders() can return the iterator,
        // so that we do not need to search the map again.
        auto it = _find_ge(I);
        assert(!changed || it != _mapping.end());

        // we do not have any overlapping interval
        if (it == _mapping.end() || I.end < it->first.start) {
            assert(!overlaps(I) && "Bug in add() or in overlaps()");
            _mapping.emplace(I, ValuesT{val});
            return true;
        }

        auto rest = I;
        assert(rest.end >= it->first.start); // we must have some overlap here
        while (it != _mapping.end()) {
            if (rest.start < it->first.start) {
                // add the gap interval
                _mapping.emplace_hint(
                        it, IntervalT(rest.start, it->first.start - 1),
                        ValuesT{val});
                rest.start = it->first.start;
                changed = true;
            } else {
                // update the existing interval and shift
                // to the next interval
                assert(rest.start == it->first.start);
                changed |= _addValue(it, val, update);
                if (it->first.end == rest.end)
                    break;

                rest.start = it->first.end + 1;
                ++it;

                // our interval spans to the right
                // after the last covered interval
                if (it == _mapping.end() || it->first.start > rest.end) {
                    _mapping.emplace_hint(it, rest, ValuesT{val});
                    changed = true;
                    break;
                }
            }
        }

        _check();
        return changed;
    }